

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

SchemeObject * Eval(SchemeObject *exp,SchemeObject *environ)

{
  char cVar1;
  SchemeObject *pSVar2;
  SchemeObject *pSVar3;
  SchemeObject **ppSVar4;
  char *__ptr;
  size_t sStack_40;
  
  while( true ) {
    cVar1 = IsSelfEvaluating(exp);
    if (cVar1 != '\0') {
      return exp;
    }
    cVar1 = IsVariable(exp);
    if (cVar1 != '\0') {
      pSVar2 = LookupVariableValue(exp,environ);
      return pSVar2;
    }
    cVar1 = IsQuote(exp);
    if (cVar1 != '\0') {
      pSVar2 = Cdr(exp);
      pSVar2 = Car(pSVar2);
      return pSVar2;
    }
    cVar1 = IsAssignment(exp);
    if (cVar1 != '\0') break;
    cVar1 = IsDefine(exp);
    if (cVar1 != '\0') {
      pSVar2 = DefinitionVariable(exp);
      pSVar3 = DefinitionValue(exp);
      pSVar3 = Eval(pSVar3,environ);
      DefineVariable(pSVar2,pSVar3,environ);
      goto LAB_001023a8;
    }
    cVar1 = IsIf(exp);
    if (cVar1 == '\0') {
      cVar1 = IsLambda(exp);
      if (cVar1 != '\0') {
        pSVar2 = LambdaParameters(exp);
        pSVar3 = LambdaBody(exp);
        pSVar2 = MakeCompoundProc(pSVar2,pSVar3,environ);
        return pSVar2;
      }
      cVar1 = IsBegin(exp);
      if (cVar1 == '\0') {
        cVar1 = IsCond(exp);
        if (cVar1 == '\0') {
          cVar1 = IsLet(exp);
          if (cVar1 == '\0') {
            cVar1 = IsAnd(exp);
            if (cVar1 == '\0') {
              cVar1 = IsOr(exp);
              if (cVar1 == '\0') {
                cVar1 = IsApplication(exp);
                if (cVar1 == '\0') {
                  __ptr = "cannot eval unknown expression type.\n";
                  sStack_40 = 0x25;
LAB_00102441:
                  fwrite(__ptr,sStack_40,1,_stderr);
                  exit(1);
                }
                pSVar2 = Operator(exp);
                pSVar2 = Eval(pSVar2,environ);
                pSVar3 = Operands(exp);
                pSVar3 = ListOfValues(pSVar3,environ);
                cVar1 = IsPrimitiveProc(pSVar2);
                if ((cVar1 == '\0') || ((pSVar2->data).pair.car != (SchemeObject *)EvalProc)) {
                  cVar1 = IsPrimitiveProc(pSVar2);
                  if ((cVar1 != '\0') && ((pSVar2->data).pair.car == (SchemeObject *)ApplyProc)) {
                    pSVar2 = ApplyOperator(pSVar3);
                    pSVar3 = ApplyOperands(pSVar3);
                  }
                  cVar1 = IsPrimitiveProc(pSVar2);
                  if (cVar1 != '\0') {
                    pSVar2 = (SchemeObject *)(*(code *)(pSVar2->data).symbol.value)(pSVar3);
                    return pSVar2;
                  }
                  cVar1 = IsCompoundProc(pSVar2);
                  if (cVar1 == '\0') {
                    __ptr = "unknown procedure type.\n";
                    sStack_40 = 0x18;
                    goto LAB_00102441;
                  }
                  environ = ExtendEnvironment((pSVar2->data).pair.car,pSVar3,
                                              (pSVar2->data).compound_proc.env);
                  exp = MakeBegin((pSVar2->data).pair.cdr);
                }
                else {
                  exp = Car(pSVar3);
                  pSVar2 = Cdr(pSVar3);
                  environ = Car(pSVar2);
                }
              }
              else {
                pSVar2 = OrTests(exp);
                cVar1 = IsTheEmptyList(pSVar2);
                if (cVar1 != '\0') {
LAB_001023f0:
                  ppSVar4 = &False;
                  goto LAB_001023af;
                }
                while( true ) {
                  cVar1 = IsLastExp(pSVar2);
                  exp = FirstExp(pSVar2);
                  if (cVar1 != '\0') break;
                  pSVar3 = Eval(exp,environ);
                  cVar1 = IsTrue(pSVar3);
                  if (cVar1 != '\0') goto LAB_001023f9;
                  pSVar2 = RestExps(pSVar2);
                }
              }
            }
            else {
              pSVar2 = AndTests(exp);
              cVar1 = IsTheEmptyList(pSVar2);
              if (cVar1 != '\0') {
LAB_001023f9:
                ppSVar4 = &True;
                goto LAB_001023af;
              }
              while( true ) {
                cVar1 = IsLastExp(pSVar2);
                exp = FirstExp(pSVar2);
                if (cVar1 != '\0') break;
                pSVar3 = Eval(exp,environ);
                cVar1 = IsFalse(pSVar3);
                if (cVar1 != '\0') goto LAB_001023f0;
                pSVar2 = RestExps(pSVar2);
              }
            }
          }
          else {
            exp = LetToApplication(exp);
          }
        }
        else {
          exp = CondToIf(exp);
        }
      }
      else {
        pSVar2 = BeginAction(exp);
        while( true ) {
          cVar1 = IsLastExp(pSVar2);
          exp = FirstExp(pSVar2);
          if (cVar1 != '\0') break;
          Eval(exp,environ);
          pSVar2 = RestExps(pSVar2);
        }
      }
    }
    else {
      pSVar2 = IfPredicate(exp);
      pSVar2 = Eval(pSVar2,environ);
      cVar1 = IsTrue(pSVar2);
      if (cVar1 == '\0') {
        exp = IfAlternative(exp);
      }
      else {
        exp = IfConsequent(exp);
      }
    }
  }
  pSVar2 = AssignmentVariable(exp);
  pSVar3 = AssignmentValue(exp);
  pSVar3 = Eval(pSVar3,environ);
  SetVariableValue(pSVar2,pSVar3,environ);
LAB_001023a8:
  ppSVar4 = &OkSymbol;
LAB_001023af:
  return *ppSVar4;
}

Assistant:

extern SchemeObject*
Eval(SchemeObject* exp, SchemeObject* environ)
{
    SchemeObject* procedure;
    SchemeObject* arguments;
    SchemeObject* result;

    tail:
    if (IsSelfEvaluating(exp)) {
        return exp;
    } else if (IsVariable(exp)) {
        return LookupVariableValue(exp, environ);
    } else if (IsQuote(exp)) {
        return TextOfQuotation(exp);
    } else if (IsAssignment(exp)) {
        return EvalAssignment(exp, environ);
    } else if (IsDefine(exp)) {
        return EvalDefinition(exp, environ);
    } else if (IsIf(exp)) {
        exp = IsTrue(Eval(IfPredicate(exp), environ)) ? IfConsequent(exp) : IfAlternative(exp);
        goto tail;
    } else if (IsLambda(exp)) {
        return MakeCompoundProc(LambdaParameters(exp), LambdaBody(exp), environ);
    } else if (IsBegin(exp)) {
        exp = BeginAction(exp);

        while (!IsLastExp(exp)) {
            Eval(FirstExp(exp), environ);
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);

        goto tail;
    } else if (IsCond(exp)) {
        exp = CondToIf(exp);
        goto tail;
    } else if (IsLet(exp)) {
        exp = LetToApplication(exp);
        goto tail;
    } else if (IsAnd(exp)) {
        exp = AndTests(exp);
        if (IsTheEmptyList(exp)) {
            return True;
        }
        while (!IsLastExp(exp)) {
            result = Eval(FirstExp(exp), environ);
            if (IsFalse(result)) {
                return False;
            }
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);
        goto tail;
    } else if (IsOr(exp)) {
        exp = OrTests(exp);
        if (IsTheEmptyList(exp)) {
            return False;
        }
        while (!IsLastExp(exp)) {
            result = Eval(FirstExp(exp), environ);
            if (IsTrue(result)) {
                return True;
            }
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);
        goto tail;
    } else if (IsApplication(exp)) {
        procedure = Eval(Operator(exp), environ);
        arguments = ListOfValues(Operands(exp), environ);

        /* handle eval specially for tail call requirement */
        if (IsPrimitiveProc(procedure) && procedure->data.primitive_proc.fn == EvalProc) {
            exp = EvalExpression(arguments);
            environ = EvalEnvironment(arguments);
            goto tail;
        }

        /* handle apply specially for tail call requirement */
        if (IsPrimitiveProc(procedure) && procedure->data.primitive_proc.fn == ApplyProc) {
            procedure = ApplyOperator(arguments);
            arguments = ApplyOperands(arguments);
        }

        if (IsPrimitiveProc(procedure)) {
            return (procedure->data.primitive_proc.fn)(arguments);
        } else if (IsCompoundProc(procedure)) {
            environ = ExtendEnvironment(procedure->data.compound_proc.parameters,
                                        arguments,
                                        procedure->data.compound_proc.env);
            exp = MakeBegin(procedure->data.compound_proc.body);
            goto tail;
        } else {
            fprintf(stderr, "unknown procedure type.\n");
            exit(1);
        }
    } else {
        fprintf(stderr, "cannot eval unknown expression type.\n");
        exit(1);
    }
    fprintf(stderr, "eval illegal state.\n");
    exit(1);
}